

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_fixed_int(char *card,FILE *out)

{
  ushort **ppuVar1;
  bool bVar2;
  char *local_28;
  char *cptr;
  FILE *out_local;
  char *card_local;
  
  for (local_28 = card + 10; *local_28 == ' '; local_28 = local_28 + 1) {
  }
  if (*local_28 == '-') {
    local_28 = local_28 + 1;
  }
  else if (*local_28 == '+') {
    local_28 = local_28 + 1;
  }
  while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_28] & 0x800) != 0) {
    local_28 = local_28 + 1;
  }
  bVar2 = (long)local_28 - (long)card == 0x1e;
  if (!bVar2) {
    sprintf(errmes,"%.8s mandatory keyword is not in integer fixed format:",card);
    wrterr(out,errmes,1);
    print_fmt(out,card,0xd);
    print_fmt(out,"          -------------------^",0xd);
  }
  card_local._4_4_ = (uint)bVar2;
  return card_local._4_4_;
}

Assistant:

int check_fixed_int(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format integer must be right justified in columns 11-30 */

    cptr = &card[10];

    while (*cptr == ' ')cptr++;  /* skip leading spaces */

    if (*cptr == '-')
        cptr++;  /* skip leading minus sign */
    else if (*cptr == '+')
        cptr++;  /* skip leading plus sign */

    while (isdigit((int) *cptr))cptr++;  /* skip digits */

    /* should be pointing to column 31 of the card */

    if ((cptr - card)  != 30) {
        sprintf(errmes,
            "%.8s mandatory keyword is not in integer fixed format:",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          -------------------^",13);

        return 0;
    } 
    return 1; 
}